

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O1

shared_lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::
try_lock_shared_handle_until<int,std::shared_timed_mutex,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (shared_lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this
          ,int *obj,shared_timed_mutex *smutex,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *tp)

{
  int iVar1;
  __gthread_time_t __ts;
  long local_28;
  long local_20;
  
  local_20 = (smutex->super___shared_timed_mutex_base)._M_rwlock.__align;
  local_28 = local_20 / 1000000000;
  local_20 = local_20 % 1000000000;
  iVar1 = pthread_rwlock_clockrdlock(obj,1,&local_28);
  if ((iVar1 == 0x23) || (iVar1 == 0x6e)) {
    __return_storage_ptr__->data = (pointer)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_pm = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
  }
  else {
    __return_storage_ptr__->data = (pointer)this;
    (__return_storage_ptr__->m_handle_lock)._M_pm = (mutex_type *)0x0;
    (__return_storage_ptr__->m_handle_lock)._M_owns = false;
  }
  (__return_storage_ptr__->m_handle_lock)._M_pm = (mutex_type *)obj;
  (__return_storage_ptr__->m_handle_lock)._M_owns = iVar1 != 0x23 && iVar1 != 0x6e;
  return __return_storage_ptr__;
}

Assistant:

shared_lock_handle<T, M>
    try_lock_shared_handle_until(const T* obj, M& smutex, const TimePoint& tp)
{
    typename shared_lock_handle<T, M>::lock_type slock(smutex, tp);
    if (slock.owns_lock()) {
        return shared_lock_handle<T, M>(obj, std::move(slock));
    } else {
        return shared_lock_handle<T, M>(nullptr, std::move(slock));
    }
}